

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgParser.cpp
# Opt level: O0

void __thiscall ArgParser::ArgParser(ArgParser *this,int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  double dVar3;
  uint local_30;
  int i;
  char **argv_local;
  int argc_local;
  ArgParser *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->output_file);
  std::__cxx11::string::string((string *)&this->log_file);
  defaultValues(this);
  local_30 = 1;
  do {
    if (argc <= (int)local_30) {
      std::operator<<((ostream *)&std::cout,"Args:\n");
      poVar2 = std::operator<<((ostream *)&std::cout,"- input: ");
      poVar2 = std::operator<<(poVar2,(string *)this);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- output: ");
      poVar2 = std::operator<<(poVar2,(string *)&this->output_file);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- width: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->width);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- height: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->height);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- iters: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->iters);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- length: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->length);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"- log: ");
      poVar2 = std::operator<<(poVar2,(string *)&this->log_file);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    iVar1 = strcmp(argv[(int)local_30],"-input");
    if (iVar1 == 0) {
      local_30 = local_30 + 1;
      if (argc <= (int)local_30) {
        __assert_fail("i < argc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                      ,0x10,"ArgParser::ArgParser(int, const char **)");
      }
      std::__cxx11::string::operator=((string *)this,argv[(int)local_30]);
    }
    else {
      iVar1 = strcmp(argv[(int)local_30],"-output");
      if (iVar1 == 0) {
        local_30 = local_30 + 1;
        if (argc <= (int)local_30) {
          __assert_fail("i < argc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                        ,0x14,"ArgParser::ArgParser(int, const char **)");
        }
        std::__cxx11::string::operator=((string *)&this->output_file,argv[(int)local_30]);
      }
      else {
        iVar1 = strcmp(argv[(int)local_30],"-size");
        if (iVar1 == 0) {
          if (argc <= (int)(local_30 + 1)) {
            __assert_fail("i < argc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                          ,0x18,"ArgParser::ArgParser(int, const char **)");
          }
          iVar1 = atoi(argv[(int)(local_30 + 1)]);
          this->width = iVar1;
          local_30 = local_30 + 2;
          if (argc <= (int)local_30) {
            __assert_fail("i < argc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                          ,0x1b,"ArgParser::ArgParser(int, const char **)");
          }
          iVar1 = atoi(argv[(int)local_30]);
          this->height = iVar1;
        }
        else {
          iVar1 = strcmp(argv[(int)local_30],"-iters");
          if (iVar1 == 0) {
            if (argc <= (int)(local_30 + 1)) {
              __assert_fail("i < argc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                            ,0x22,"ArgParser::ArgParser(int, const char **)");
            }
            iVar1 = atoi(argv[(int)(local_30 + 1)]);
            this->iters = iVar1;
          }
          else {
            iVar1 = strcmp(argv[(int)local_30],"-length");
            if (iVar1 == 0) {
              if (argc <= (int)(local_30 + 1)) {
                __assert_fail("i < argc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                              ,0x26,"ArgParser::ArgParser(int, const char **)");
              }
              dVar3 = atof(argv[(int)(local_30 + 1)]);
              this->length = (float)dVar3;
            }
            else {
              iVar1 = strcmp(argv[(int)local_30],"-log");
              if (iVar1 != 0) {
                printf("Unknown command line argument %d: \'%s\'\n",(ulong)local_30,
                       argv[(int)local_30]);
                exit(1);
              }
              if (argc <= (int)(local_30 + 1)) {
                __assert_fail("i < argc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                              ,0x2d,"ArgParser::ArgParser(int, const char **)");
              }
              std::__cxx11::string::operator=((string *)&this->log_file,argv[(int)(local_30 + 1)]);
            }
          }
          local_30 = local_30 + 1;
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

ArgParser::ArgParser(int argc, const char *argv[]) {
    defaultValues();

    for (int i = 1; i < argc; i++) {
        // rendering output
        if (!strcmp(argv[i], "-input")) {
            i++;
            assert (i < argc);
            input_file = argv[i];
        } else if (!strcmp(argv[i], "-output")) {
            i++;
            assert (i < argc);
            output_file = argv[i];
        } else if (!strcmp(argv[i], "-size")) {
            i++;
            assert (i < argc);
            width = atoi(argv[i]);
            i++;
            assert (i < argc);
            height = atoi(argv[i]);
        }

        // rendering options
        else if (!strcmp(argv[i], "-iters")) {
            i++;
            assert (i < argc);
            iters = atoi(argv[i]);
        } else if (!strcmp(argv[i], "-length")) {
            i++;
            assert (i < argc);
            length = atof(argv[i]);
        }

        // logging
        else if (!strcmp(argv[i], "-log")) {
            i++;
            assert (i < argc);
            log_file = argv[i];
        }

        // Unknown argument.
        else {
            printf("Unknown command line argument %d: '%s'\n", i, argv[i]);
            exit(1);
        }
    }

    std::cout << "Args:\n";
    std::cout << "- input: " << input_file << std::endl;
    std::cout << "- output: " << output_file << std::endl;
    std::cout << "- width: " << width << std::endl;
    std::cout << "- height: " << height << std::endl;
    std::cout << "- iters: " << iters << std::endl;
    std::cout << "- length: " << length << std::endl;
    std::cout << "- log: " << log_file << std::endl;
}